

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_a64_insn(CPUARMState_conflict *env,DisasContext_conflict1 *s)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint64_t pc;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn;
  DisasContext_conflict1 *s_local;
  CPUARMState_conflict *env_local;
  
  s->pc_curr = (s->base).pc_next;
  uVar2 = arm_ldl_code(env,(s->base).pc_next,s->sctlr_b != 0);
  s->insn = uVar2;
  (s->base).pc_next = (s->base).pc_next + 4;
  _Var1 = _hook_exists_bounded(env->uc->hook[2].head,s->pc_curr);
  if (_Var1) {
    tcg_ctx_00 = env->uc->tcg_ctx;
    gen_a64_set_pc_im_aarch64(tcg_ctx_00,s->pc_curr);
    gen_uc_tracecode(tcg_ctx_00,4,2,env->uc,s->pc_curr);
    check_exit_request_aarch64(tcg_ctx_00);
  }
  s->fp_access_checked = false;
  _Var1 = isar_feature_aa64_bti(s->isar);
  if ((_Var1) && ((s->base).num_insns == 1)) {
    _Var1 = is_guarded_page(env,s);
    s->guarded_page = _Var1;
    if ((s->btype != '\0') &&
       (((s->guarded_page & 1U) != 0 &&
        (_Var1 = btype_destination_ok(uVar2,(_Bool)(s->bt & 1),(int)s->btype), !_Var1)))) {
      pc = s->pc_curr;
      uVar2 = syn_btitrap((int)s->btype);
      uVar3 = default_exception_el(s);
      gen_exception_insn(s,pc,1,uVar2,uVar3);
      return;
    }
  }
  uVar3 = extract32(uVar2,0x19,4);
  switch(uVar3) {
  case 0:
  case 1:
  case 3:
    unallocated_encoding_aarch64(s);
    break;
  case 2:
    _Var1 = isar_feature_aa64_sve(s->isar);
    if ((!_Var1) || (_Var1 = disas_sve_aarch64(s,uVar2), !_Var1)) {
      unallocated_encoding_aarch64(s);
    }
    break;
  case 4:
  case 6:
  case 0xc:
  case 0xe:
    disas_ldst(s,uVar2);
    break;
  case 5:
  case 0xd:
    disas_data_proc_reg(s,uVar2);
    break;
  case 7:
  case 0xf:
    disas_data_proc_simd_fp(s,uVar2);
    break;
  case 8:
  case 9:
    disas_data_proc_imm(s,uVar2);
    break;
  case 10:
  case 0xb:
    disas_b_exc_sys(s,uVar2);
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x3906,"void disas_a64_insn(CPUARMState *, DisasContext *)");
  }
  free_tmp_a64(s);
  if (('\0' < s->btype) && ((s->base).is_jmp != DISAS_NORETURN)) {
    reset_btype(s);
  }
  return;
}

Assistant:

static void disas_a64_insn(CPUARMState *env, DisasContext *s)
{
    uint32_t insn;

    s->pc_curr = s->base.pc_next;
    insn = arm_ldl_code(env, s->base.pc_next, s->sctlr_b);

    s->insn = insn;
    s->base.pc_next += 4;

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(env->uc, UC_HOOK_CODE, s->pc_curr)) {

        // Sync PC in advance
        TCGContext *tcg_ctx = env->uc->tcg_ctx;
        gen_a64_set_pc_im(tcg_ctx, s->pc_curr);

        gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, env->uc, s->pc_curr);
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    s->fp_access_checked = false;

    if (dc_isar_feature(aa64_bti, s)) {
        if (s->base.num_insns == 1) {
            /*
             * At the first insn of the TB, compute s->guarded_page.
             * We delayed computing this until successfully reading
             * the first insn of the TB, above.  This (mostly) ensures
             * that the softmmu tlb entry has been populated, and the
             * page table GP bit is available.
             *
             * Note that we need to compute this even if btype == 0,
             * because this value is used for BR instructions later
             * where ENV is not available.
             */
            s->guarded_page = is_guarded_page(env, s);

            /* First insn can have btype set to non-zero.  */
            tcg_debug_assert(s->btype >= 0);

            /*
             * Note that the Branch Target Exception has fairly high
             * priority -- below debugging exceptions but above most
             * everything else.  This allows us to handle this now
             * instead of waiting until the insn is otherwise decoded.
             */
            if (s->btype != 0
                && s->guarded_page
                && !btype_destination_ok(insn, s->bt, s->btype)) {
                gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                                   syn_btitrap(s->btype),
                                   default_exception_el(s));
                return;
            }
        } else {
            /* Not the first insn: btype must be 0.  */
            tcg_debug_assert(s->btype == 0);
        }
    }

    switch (extract32(insn, 25, 4)) {
    case 0x0: case 0x1: case 0x3: /* UNALLOCATED */
        unallocated_encoding(s);
        break;
    case 0x2:
        if (!dc_isar_feature(aa64_sve, s) || !disas_sve(s, insn)) {
            unallocated_encoding(s);
        }
        break;
    case 0x8: case 0x9: /* Data processing - immediate */
        disas_data_proc_imm(s, insn);
        break;
    case 0xa: case 0xb: /* Branch, exception generation and system insns */
        disas_b_exc_sys(s, insn);
        break;
    case 0x4:
    case 0x6:
    case 0xc:
    case 0xe:      /* Loads and stores */
        disas_ldst(s, insn);
        break;
    case 0x5:
    case 0xd:      /* Data processing - register */
        disas_data_proc_reg(s, insn);
        break;
    case 0x7:
    case 0xf:      /* Data processing - SIMD and floating point */
        disas_data_proc_simd_fp(s, insn);
        break;
    default:
        assert(FALSE); /* all 15 cases should be handled above */
        break;
    }

    /* if we allocated any temporaries, free them here */
    free_tmp_a64(s);

    /*
     * After execution of most insns, btype is reset to 0.
     * Note that we set btype == -1 when the insn sets btype.
     */
    if (s->btype > 0 && s->base.is_jmp != DISAS_NORETURN) {
        reset_btype(s);
    }
}